

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O2

void alloc_fs_workspace(j_decompress_ptr cinfo)

{
  JDIMENSION JVar1;
  jpeg_color_quantizer *pjVar2;
  _func_void_j_decompress_ptr *p_Var3;
  long lVar4;
  
  pjVar2 = cinfo->cquantize;
  JVar1 = cinfo->output_width;
  for (lVar4 = 0; lVar4 < cinfo->out_color_components; lVar4 = lVar4 + 1) {
    p_Var3 = (_func_void_j_decompress_ptr *)
             (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,(ulong)(JVar1 + 2) * 2);
    (&pjVar2[3].finish_pass)[lVar4] = p_Var3;
  }
  return;
}

Assistant:

LOCAL(void)
alloc_fs_workspace (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  size_t arraysize;
  int i;

  arraysize = (size_t) ((cinfo->output_width + 2) * SIZEOF(FSERROR));
  for (i = 0; i < cinfo->out_color_components; i++) {
    cquantize->fserrors[i] = (FSERRPTR)
      (*cinfo->mem->alloc_large)((j_common_ptr) cinfo, JPOOL_IMAGE, arraysize);
  }
}